

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * varinfo(lua_State *L,TValue *o)

{
  Proto *p;
  int reg_00;
  int lastpc;
  char *pcVar1;
  char *pcStack_30;
  int reg;
  char *kind;
  char *name;
  CallInfo *ci;
  TValue *o_local;
  lua_State *L_local;
  
  name = (char *)L->ci;
  kind = (char *)0x0;
  pcStack_30 = (char *)0x0;
  ci = (CallInfo *)o;
  o_local = (TValue *)L;
  if ((((((CallInfo *)name)->callstatus & 0x8000) == 0) &&
      (pcStack_30 = getupvalname((CallInfo *)name,o,&kind), pcStack_30 == (char *)0x0)) &&
     (reg_00 = instack((CallInfo *)name,(TValue *)ci), -1 < reg_00)) {
    p = *(Proto **)(**(long **)name + 0x18);
    lastpc = currentpc((CallInfo *)name);
    pcStack_30 = getobjname(p,lastpc,reg_00,&kind);
  }
  pcVar1 = formatvarinfo((lua_State *)o_local,pcStack_30,kind);
  return pcVar1;
}

Assistant:

static const char *varinfo (lua_State *L, const TValue *o) {
  CallInfo *ci = L->ci;
  const char *name = NULL;  /* to avoid warnings */
  const char *kind = NULL;
  if (isLua(ci)) {
    kind = getupvalname(ci, o, &name);  /* check whether 'o' is an upvalue */
    if (!kind) {  /* not an upvalue? */
      int reg = instack(ci, o);  /* try a register */
      if (reg >= 0)  /* is 'o' a register? */
        kind = getobjname(ci_func(ci)->p, currentpc(ci), reg, &name);
    }
  }
  return formatvarinfo(L, kind, name);
}